

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

void * __thiscall DeviceTy::getTgtPtrBegin(DeviceTy *this,void *HstPtrBegin,int64_t Size)

{
  reference pHVar1;
  void *pvVar2;
  long in_RSI;
  int64_t in_RDI;
  LookupResult LVar3;
  uintptr_t tp;
  HostDataToTargetTy *HT;
  LookupResult lr;
  uintptr_t hp;
  byte local_38;
  void *in_stack_fffffffffffffff8;
  
  LVar3 = lookupMapping((DeviceTy *)tp,in_stack_fffffffffffffff8,in_RDI);
  local_38 = LVar3.Flags._0_1_;
  if (((((undefined1  [16])LVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      ((local_38 >> 1 & 1) == 0)) && ((local_38 >> 2 & 1) == 0)) {
    pvVar2 = (void *)0x0;
  }
  else {
    pHVar1 = std::_List_iterator<HostDataToTargetTy>::operator*
                       ((_List_iterator<HostDataToTargetTy> *)0x103938);
    pvVar2 = (void *)(pHVar1->TgtPtrBegin + (in_RSI - pHVar1->HstPtrBegin));
  }
  return pvVar2;
}

Assistant:

void *DeviceTy::getTgtPtrBegin(void *HstPtrBegin, int64_t Size) {
  uintptr_t hp = (uintptr_t)HstPtrBegin;
  LookupResult lr = lookupMapping(HstPtrBegin, Size);
  if (lr.Flags.IsContained || lr.Flags.ExtendsBefore || lr.Flags.ExtendsAfter) {
    auto &HT = *lr.Entry;
    uintptr_t tp = HT.TgtPtrBegin + (hp - HT.HstPtrBegin);
    return (void *)tp;
  }

  return NULL;
}